

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaPrintHex(FILE *fp,int digits,DdApaNumber number)

{
  int iVar1;
  int local_2c;
  int result;
  int i;
  DdApaNumber number_local;
  int digits_local;
  FILE *fp_local;
  
  local_2c = 0;
  while( true ) {
    if (digits <= local_2c) {
      return 1;
    }
    iVar1 = fprintf((FILE *)fp,"%08x",(ulong)number[local_2c]);
    if (iVar1 == -1) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int
Cudd_ApaPrintHex(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;

    for (i = 0; i < digits; i++) {
        result = fprintf(fp,DD_APA_HEXPRINT,number[i]);
        if (result == EOF)
            return(0);
    }
    return(1);

}